

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ini_file.cxx
# Opt level: O0

bool __thiscall xray_re::xr_ini_file::parse(xr_ini_file *this,char *p,char *end,char *path)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  ini_item *piVar4;
  char *pcVar5;
  reference ppiVar6;
  char *s2;
  reference ppiVar7;
  string *this_00;
  bool bVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  ini_item **local_280;
  const_iterator local_278;
  __normal_iterator<xray_re::xr_ini_file::ini_item_**,_std::vector<xray_re::xr_ini_file::ini_item_*,_std::allocator<xray_re::xr_ini_file::ini_item_*>_>_>
  local_270;
  ini_item_pred local_268;
  __normal_iterator<xray_re::xr_ini_file::ini_item_**,_std::vector<xray_re::xr_ini_file::ini_item_*,_std::allocator<xray_re::xr_ini_file::ini_item_*>_>_>
  local_260;
  __normal_iterator<xray_re::xr_ini_file::ini_item_**,_std::vector<xray_re::xr_ini_file::ini_item_*,_std::allocator<xray_re::xr_ini_file::ini_item_*>_>_>
  local_258;
  __normal_iterator<xray_re::xr_ini_file::ini_item_**,_std::vector<xray_re::xr_ini_file::ini_item_*,_std::allocator<xray_re::xr_ini_file::ini_item_*>_>_>
  local_250;
  ini_item_vec_it it_1;
  ini_section_pred local_240;
  __normal_iterator<xray_re::xr_ini_file::ini_section_**,_std::vector<xray_re::xr_ini_file::ini_section_*,_std::allocator<xray_re::xr_ini_file::ini_section_*>_>_>
  local_238;
  __normal_iterator<xray_re::xr_ini_file::ini_section_**,_std::vector<xray_re::xr_ini_file::ini_section_*,_std::allocator<xray_re::xr_ini_file::ini_section_*>_>_>
  local_230;
  ini_section **local_228;
  ini_section **local_220;
  const_iterator local_218;
  __normal_iterator<xray_re::xr_ini_file::ini_section_**,_std::vector<xray_re::xr_ini_file::ini_section_*,_std::allocator<xray_re::xr_ini_file::ini_section_*>_>_>
  local_210;
  ini_section_pred local_208;
  __normal_iterator<xray_re::xr_ini_file::ini_section_**,_std::vector<xray_re::xr_ini_file::ini_section_*,_std::allocator<xray_re::xr_ini_file::ini_section_*>_>_>
  local_200;
  __normal_iterator<xray_re::xr_ini_file::ini_section_**,_std::vector<xray_re::xr_ini_file::ini_section_*,_std::allocator<xray_re::xr_ini_file::ini_section_*>_>_>
  local_1f8;
  __normal_iterator<xray_re::xr_ini_file::ini_section_**,_std::vector<xray_re::xr_ini_file::ini_section_*,_std::allocator<xray_re::xr_ini_file::ini_section_*>_>_>
  local_1f0;
  ini_section_vec_it it;
  int local_1e0;
  uint local_1dc;
  int c;
  uint line;
  string name;
  ini_item *item;
  ini_section *section;
  char temp [256];
  char *file;
  undefined1 local_90 [8];
  string extension;
  string fname;
  string folder;
  char *path_local;
  char *end_local;
  char *p_local;
  xr_ini_file *this_local;
  
  end_local = p;
  p_local = (char *)this;
  std::__cxx11::string::string((string *)(fname.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(extension.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_90);
  xr_file_system::split_path
            (path,(string *)(fname.field_2._M_local_buf + 8),
             (string *)(extension.field_2._M_local_buf + 8),(string *)local_90);
  std::__cxx11::string::append((string *)(extension.field_2._M_local_buf + 8));
  temp._248_8_ = std::__cxx11::string::c_str();
  item = (ini_item *)0x0;
  std::__cxx11::string::string((string *)&c);
  local_1dc = 1;
  do {
    local_1e0 = skip_blank(&end_local,end);
    if (end <= end_local && local_1e0 != 0x101) {
      __assert_fail("p < end || c == IF_EOF",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_ini_file.cxx"
                    ,0x113,
                    "bool xray_re::xr_ini_file::parse(const char *, const char *, const char *)");
    }
    if (local_1e0 == 10 || local_1e0 == 0xd) {
      __assert_fail("c != \'\\n\' && c != \'\\r\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_ini_file.cxx"
                    ,0x114,
                    "bool xray_re::xr_ini_file::parse(const char *, const char *, const char *)");
    }
    if (local_1e0 == 0x5b) {
      end_local = end_local + 1;
      iVar3 = read_name(&end_local,end,0x100,(char *)&section);
      if ((iVar3 != 0x5d) || ((char)section == '\0')) {
        msg("bad section header at %s:%u",temp._248_8_,(ulong)local_1dc);
        this_local._7_1_ = 0;
        goto LAB_001c4ac7;
      }
      local_1f8._M_current =
           (ini_section **)
           std::
           vector<xray_re::xr_ini_file::ini_section_*,_std::allocator<xray_re::xr_ini_file::ini_section_*>_>
           ::begin(&this->m_sections);
      local_200._M_current =
           (ini_section **)
           std::
           vector<xray_re::xr_ini_file::ini_section_*,_std::allocator<xray_re::xr_ini_file::ini_section_*>_>
           ::end(&this->m_sections);
      ini_section_pred::ini_section_pred(&local_208,(char *)&section);
      local_1f0 = lower_bound_if<__gnu_cxx::__normal_iterator<xray_re::xr_ini_file::ini_section**,std::vector<xray_re::xr_ini_file::ini_section*,std::allocator<xray_re::xr_ini_file::ini_section*>>>,xray_re::xr_ini_file::ini_section_pred>
                            (local_1f8,local_200,local_208);
      local_210._M_current =
           (ini_section **)
           std::
           vector<xray_re::xr_ini_file::ini_section_*,_std::allocator<xray_re::xr_ini_file::ini_section_*>_>
           ::end(&this->m_sections);
      bVar2 = __gnu_cxx::operator!=(&local_1f0,&local_210);
      bVar8 = false;
      if (bVar2) {
        __gnu_cxx::
        __normal_iterator<xray_re::xr_ini_file::ini_section_**,_std::vector<xray_re::xr_ini_file::ini_section_*,_std::allocator<xray_re::xr_ini_file::ini_section_*>_>_>
        ::operator*(&local_1f0);
        pcVar5 = (char *)std::__cxx11::string::c_str();
        iVar3 = xr_stricmp(pcVar5,(char *)&section);
        bVar8 = iVar3 == 0;
      }
      if (bVar8) {
        msg("duplicate section %s at %s:%u",&section,temp._248_8_,(ulong)local_1dc);
        this_local._7_1_ = 0;
        goto LAB_001c4ac7;
      }
      piVar4 = (ini_item *)operator_new(0x38);
      ini_section::ini_section((ini_section *)piVar4,(char *)&section);
      item = piVar4;
      __gnu_cxx::
      __normal_iterator<xray_re::xr_ini_file::ini_section*const*,std::vector<xray_re::xr_ini_file::ini_section*,std::allocator<xray_re::xr_ini_file::ini_section*>>>
      ::__normal_iterator<xray_re::xr_ini_file::ini_section**>
                ((__normal_iterator<xray_re::xr_ini_file::ini_section*const*,std::vector<xray_re::xr_ini_file::ini_section*,std::allocator<xray_re::xr_ini_file::ini_section*>>>
                  *)&local_218,&local_1f0);
      local_220 = (ini_section **)
                  std::
                  vector<xray_re::xr_ini_file::ini_section_*,_std::allocator<xray_re::xr_ini_file::ini_section_*>_>
                  ::insert(&this->m_sections,local_218,(value_type *)&item);
      end_local = end_local + 1;
      local_1e0 = skip_blank(&end_local,end);
      if (local_1e0 == 0x3a) {
        do {
          end_local = end_local + 1;
          local_1e0 = read_name(&end_local,end,0x100,(char *)&section);
          local_230._M_current =
               (ini_section **)
               std::
               vector<xray_re::xr_ini_file::ini_section_*,_std::allocator<xray_re::xr_ini_file::ini_section_*>_>
               ::begin(&this->m_sections);
          local_238._M_current =
               (ini_section **)
               std::
               vector<xray_re::xr_ini_file::ini_section_*,_std::allocator<xray_re::xr_ini_file::ini_section_*>_>
               ::end(&this->m_sections);
          ini_section_pred::ini_section_pred(&local_240,(char *)&section);
          local_228 = (ini_section **)
                      lower_bound_if<__gnu_cxx::__normal_iterator<xray_re::xr_ini_file::ini_section**,std::vector<xray_re::xr_ini_file::ini_section*,std::allocator<xray_re::xr_ini_file::ini_section*>>>,xray_re::xr_ini_file::ini_section_pred>
                                (local_230,local_238,local_240);
          local_1f0 = (__normal_iterator<xray_re::xr_ini_file::ini_section_**,_std::vector<xray_re::xr_ini_file::ini_section_*,_std::allocator<xray_re::xr_ini_file::ini_section_*>_>_>
                       )local_228;
          it_1._M_current =
               (ini_item **)
               std::
               vector<xray_re::xr_ini_file::ini_section_*,_std::allocator<xray_re::xr_ini_file::ini_section_*>_>
               ::end(&this->m_sections);
          bVar2 = __gnu_cxx::operator==
                            (&local_1f0,
                             (__normal_iterator<xray_re::xr_ini_file::ini_section_**,_std::vector<xray_re::xr_ini_file::ini_section_*,_std::allocator<xray_re::xr_ini_file::ini_section_*>_>_>
                              *)&it_1);
          bVar8 = true;
          if (!bVar2) {
            __gnu_cxx::
            __normal_iterator<xray_re::xr_ini_file::ini_section_**,_std::vector<xray_re::xr_ini_file::ini_section_*,_std::allocator<xray_re::xr_ini_file::ini_section_*>_>_>
            ::operator*(&local_1f0);
            pcVar5 = (char *)std::__cxx11::string::c_str();
            iVar3 = xr_stricmp(pcVar5,(char *)&section);
            bVar8 = iVar3 != 0;
          }
          piVar4 = item;
          if (bVar8) {
            msg("bad section reference \'%s\' at %s:%u",&section,temp._248_8_,(ulong)local_1dc);
            break;
          }
          ppiVar6 = __gnu_cxx::
                    __normal_iterator<xray_re::xr_ini_file::ini_section_**,_std::vector<xray_re::xr_ini_file::ini_section_*,_std::allocator<xray_re::xr_ini_file::ini_section_*>_>_>
                    ::operator*(&local_1f0);
          ini_section::merge((ini_section *)piVar4,*ppiVar6);
        } while (local_1e0 == 0x2c);
      }
    }
    else if (((local_1e0 == 0x100) || (local_1e0 == 0x101)) || (bVar8 = is_name(local_1e0), !bVar8))
    {
      if (local_1e0 == 0x23) {
        end_local = end_local + 1;
        iVar3 = read_name(&end_local,end,0x100,(char *)&section);
        if ((iVar3 != 0x22) || (iVar3 = strcmp((char *)&section,"include"), iVar3 != 0)) {
          msg("bad directive %s at %s:%u",&section,temp._248_8_,(ulong)local_1dc);
          this_local._7_1_ = 0;
          goto LAB_001c4ac7;
        }
        end_local = end_local + 1;
        iVar3 = read_name(&end_local,end,0x100,(char *)&section);
        if ((iVar3 != 0x22) || ((char)section == '\0')) {
          msg("bad include at %s:%u",temp._248_8_,(ulong)local_1dc);
          this_local._7_1_ = 0;
          goto LAB_001c4ac7;
        }
        std::operator+(&local_2a0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&fname.field_2 + 8),(char *)&section);
        pcVar5 = (char *)std::__cxx11::string::c_str();
        bVar8 = load_include(this,pcVar5);
        std::__cxx11::string::~string((string *)&local_2a0);
        if (((bVar8 ^ 0xffU) & 1) != 0) {
          this_local._7_1_ = 0;
          goto LAB_001c4ac7;
        }
        end_local = end_local + 1;
        local_1e0 = skip_blank(&end_local,end);
      }
    }
    else {
      if (item == (ini_item *)0x0) {
        msg("item without section at %s:%u",temp._248_8_,(ulong)local_1dc);
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_ini_file.cxx"
                      ,0x136,
                      "bool xray_re::xr_ini_file::parse(const char *, const char *, const char *)");
      }
      local_1e0 = read_item(&end_local,end,(string *)&c,true);
      local_258._M_current = (ini_item **)ini_section::begin((ini_section *)item);
      local_260._M_current = (ini_item **)ini_section::end((ini_section *)item);
      pcVar5 = (char *)std::__cxx11::string::c_str();
      ini_item_pred::ini_item_pred(&local_268,pcVar5);
      local_250 = lower_bound_if<__gnu_cxx::__normal_iterator<xray_re::xr_ini_file::ini_item**,std::vector<xray_re::xr_ini_file::ini_item*,std::allocator<xray_re::xr_ini_file::ini_item*>>>,xray_re::xr_ini_file::ini_item_pred>
                            (local_258,local_260,local_268);
      local_270._M_current = (ini_item **)ini_section::end((ini_section *)item);
      bVar2 = __gnu_cxx::operator!=(&local_250,&local_270);
      bVar8 = false;
      if (bVar2) {
        __gnu_cxx::
        __normal_iterator<xray_re::xr_ini_file::ini_item_**,_std::vector<xray_re::xr_ini_file::ini_item_*,_std::allocator<xray_re::xr_ini_file::ini_item_*>_>_>
        ::operator*(&local_250);
        pcVar5 = (char *)std::__cxx11::string::c_str();
        s2 = (char *)std::__cxx11::string::c_str();
        iVar3 = xr_stricmp(pcVar5,s2);
        bVar8 = iVar3 == 0;
      }
      if (bVar8) {
        ppiVar7 = __gnu_cxx::
                  __normal_iterator<xray_re::xr_ini_file::ini_item_**,_std::vector<xray_re::xr_ini_file::ini_item_*,_std::allocator<xray_re::xr_ini_file::ini_item_*>_>_>
                  ::operator*(&local_250);
        name.field_2._8_8_ = *ppiVar7;
      }
      else {
        piVar4 = (ini_item *)operator_new(0x40);
        ini_item::ini_item(piVar4,(string *)&c);
        this_00 = &item->value;
        name.field_2._8_8_ = piVar4;
        __gnu_cxx::
        __normal_iterator<xray_re::xr_ini_file::ini_item*const*,std::vector<xray_re::xr_ini_file::ini_item*,std::allocator<xray_re::xr_ini_file::ini_item*>>>
        ::__normal_iterator<xray_re::xr_ini_file::ini_item**>
                  ((__normal_iterator<xray_re::xr_ini_file::ini_item*const*,std::vector<xray_re::xr_ini_file::ini_item*,std::allocator<xray_re::xr_ini_file::ini_item*>>>
                    *)&local_278,&local_250);
        local_280 = (ini_item **)
                    std::
                    vector<xray_re::xr_ini_file::ini_item_*,_std::allocator<xray_re::xr_ini_file::ini_item_*>_>
                    ::insert((vector<xray_re::xr_ini_file::ini_item_*,_std::allocator<xray_re::xr_ini_file::ini_item_*>_>
                              *)this_00,local_278,(value_type *)((long)&name.field_2 + 8));
      }
      if (local_1e0 == 0x3d) {
        end_local = end_local + 1;
        local_1e0 = read_item(&end_local,end,(string *)(name.field_2._8_8_ + 0x20),false);
      }
      else {
        std::__cxx11::string::clear();
      }
    }
    if (local_1e0 == 0x101) {
      this_local._7_1_ = 1;
LAB_001c4ac7:
      it._M_current._4_4_ = 1;
      std::__cxx11::string::~string((string *)&c);
      std::__cxx11::string::~string((string *)local_90);
      std::__cxx11::string::~string((string *)(extension.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(fname.field_2._M_local_buf + 8));
      return (bool)(this_local._7_1_ & 1);
    }
    if (local_1e0 == 0x100) {
      end_local = end_local + 1;
    }
    else {
      msg("ignoring trailing garbage at %s:%u",temp._248_8_,(ulong)local_1dc);
      do {
        if (end_local == end) break;
        pcVar5 = end_local + 1;
        cVar1 = *end_local;
        end_local = pcVar5;
      } while (cVar1 != '\n');
    }
    local_1dc = local_1dc + 1;
  } while( true );
}

Assistant:

bool xr_ini_file::parse(const char* p, const char* end, const char* path)
{
	std::string folder, fname, extension;
	xr_file_system::split_path(path, &folder, &fname, &extension);
	fname.append(extension);
	const char* file = fname.c_str();

	char temp[256];
	ini_section* section = 0;
	ini_item* item;
	std::string name;
	for (unsigned line = 1;; ++line) {
		int c = skip_blank(&p, end);
		xr_assert(p < end || c == IF_EOF);
		xr_assert(c != '\n' && c != '\r');
		if (c == '[') {
			++p;
			c = read_name(&p, end, sizeof(temp), temp);
			if (c != ']' || temp[0] == 0) {
				msg("bad section header at %s:%u", file, line);
				return false;
			}
			ini_section_vec_it it = lower_bound_if(m_sections.begin(), m_sections.end(), ini_section_pred(temp));
			if (it != m_sections.end() && xr_stricmp((*it)->name.c_str(), temp) == 0) {
				msg("duplicate section %s at %s:%u", temp, file, line);
				return false;
			}
			section = new ini_section(temp);
			m_sections.insert(it, section);
			++p;
			c = skip_blank(&p, end);
			if (c == ':') {
				for (;;) {
					++p;
					c = read_name(&p, end, sizeof(temp), temp);
					it = lower_bound_if(m_sections.begin(), m_sections.end(), ini_section_pred(temp));
					if (it == m_sections.end() || xr_stricmp((*it)->name.c_str(), temp) != 0) {
						msg("bad section reference '%s' at %s:%u", temp, file, line);
						break;
					}
					section->merge(*it);
					if (c != ',')
						break;
				}
			}
		} else if (c != IF_EOL && c != IF_EOF && is_name(c)) {
			if (section == 0) {
				msg("item without section at %s:%u", file, line);
				xr_not_expected();
			}
			c = read_item(&p, end, name, true);
			ini_item_vec_it it = lower_bound_if(section->begin(), section->end(), ini_item_pred(name.c_str()));
			if (it != section->end() && xr_stricmp((*it)->name.c_str(), name.c_str()) == 0) {
				item = *it;
			} else {
				item = new ini_item(name);
				section->items.insert(it, item);
			}
			if (c == '=') {
				++p;
				c = read_item(&p, end, item->value, false);
			} else {
				item->value.clear();
			}
		} else if (c == '#') {
			++p;
			c = read_name(&p, end, sizeof(temp), temp);
			if (c != '\"' || std::strcmp(temp, "include") != 0) {
				msg("bad directive %s at %s:%u", temp, file, line);
				return false;
			}
			++p;
			c = read_name(&p, end, sizeof(temp), temp);
			if (c != '\"' || temp[0] == 0) {
				msg("bad include at %s:%u", file, line);
				return false;
			}

			if (!load_include((folder + temp).c_str()))
				return false;

			++p;
			c = skip_blank(&p, end);
		}
		if (c == IF_EOF) {
			break;
		} else if (c != IF_EOL) {
			msg("ignoring trailing garbage at %s:%u", file, line);
			while (p != end) {
				if (*p++ == '\n')
					break;
			}
		} else {
			++p;
		}
	}
	return true;
}